

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_coefficients_to_spectrum.cc
# Opt level: O0

bool __thiscall
sptk::FilterCoefficientsToSpectrum::Run
          (FilterCoefficientsToSpectrum *this,
          vector<double,_std::allocator<double>_> *numerator_coefficients,
          vector<double,_std::allocator<double>_> *denominator_coefficients,
          vector<double,_std::allocator<double>_> *spectrum,Buffer *buffer)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  const_reference pvVar7;
  int iVar8;
  int iVar9;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> in_RDI;
  long in_R8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  double tmp_1;
  double tmp;
  double gain;
  int i_1;
  double *y;
  double *yi;
  double *yr;
  int i;
  double *x;
  double *xi;
  double *xr;
  int output_length;
  int denominator_length;
  int numerator_length;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdf8;
  anon_class_8_1_898bf87d in_stack_fffffffffffffe00;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe08;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe10;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe18;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe20;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last1;
  Buffer *in_stack_fffffffffffffeb8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffec0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffec8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffed0;
  RealValuedFastFourierTransform *in_stack_fffffffffffffed8;
  int local_10c;
  int local_9c;
  bool local_1;
  
  iVar8 = *(int *)(in_RDI._M_current + 1) + 1;
  iVar9 = *(int *)((long)in_RDI._M_current + 0xc) + 1;
  if ((((((ulong)in_RDI._M_current[0x19] & 1) == 0) ||
       (sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RSI), sVar3 != (long)iVar8))
      || (sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RDX), sVar3 != (long)iVar9))
     || ((in_RCX == (vector<double,_std::allocator<double>_> *)0x0 || (in_R8 == 0)))) {
    local_1 = false;
  }
  else {
    iVar2 = *(int *)(in_RDI._M_current + 2) / 2 + 1;
    sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RCX);
    if (sVar3 != (long)iVar2) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe20._M_current,
                 (size_type)in_stack_fffffffffffffe18._M_current);
    }
    sVar3 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_R8 + 0x40));
    if (sVar3 < (ulong)(long)*(int *)(in_RDI._M_current + 2)) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe20._M_current,
                 (size_type)in_stack_fffffffffffffe18._M_current);
    }
    sVar3 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_R8 + 0x88));
    if (sVar3 < (ulong)(long)iVar2) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe20._M_current,
                 (size_type)in_stack_fffffffffffffe18._M_current);
    }
    sVar3 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_R8 + 0xa0));
    if (sVar3 < (ulong)(long)iVar2) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe20._M_current,
                 (size_type)in_stack_fffffffffffffe18._M_current);
    }
    if (iVar8 != 1) {
      std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffdf8);
      std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffdf8);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffdf8);
      std::
      copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
                 in_RDI._M_current,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffdf8);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                in_stack_fffffffffffffe08._M_current,(difference_type)in_stack_fffffffffffffe00.gain
               );
      std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffdf8);
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                 (double *)in_stack_fffffffffffffe00.gain);
      bVar1 = RealValuedFastFourierTransform::Run
                        (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                         in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                         in_stack_fffffffffffffeb8);
      if (!bVar1) {
        return false;
      }
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_R8 + 0x58),0);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_R8 + 0x70),0);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_R8 + 0x88),0);
      for (local_9c = 0; local_9c < iVar2; local_9c = local_9c + 1) {
        pvVar6[local_9c] = pvVar4[local_9c] * pvVar4[local_9c] + pvVar5[local_9c] * pvVar5[local_9c]
        ;
      }
    }
    if (iVar9 != 1) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_R8 + 0x40),0);
      *pvVar4 = 1.0;
      std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffdf8);
      __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *)
                in_stack_fffffffffffffe08._M_current,(difference_type)in_stack_fffffffffffffe00.gain
               );
      std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffdf8);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffdf8);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                in_stack_fffffffffffffe08._M_current,(difference_type)in_stack_fffffffffffffe00.gain
               );
      std::
      copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
                 in_RDI._M_current,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffdf8);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                in_stack_fffffffffffffe08._M_current,(difference_type)in_stack_fffffffffffffe00.gain
               );
      std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffdf8);
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                 (double *)in_stack_fffffffffffffe00.gain);
      bVar1 = RealValuedFastFourierTransform::Run
                        (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                         in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                         in_stack_fffffffffffffeb8);
      if (!bVar1) {
        return false;
      }
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_R8 + 0x58),0);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_R8 + 0x70),0);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_R8 + 0xa0),0);
      for (local_10c = 0; local_10c < iVar2; local_10c = local_10c + 1) {
        pvVar6[local_10c] =
             pvVar4[local_10c] * pvVar4[local_10c] + pvVar5[local_10c] * pvVar5[local_10c];
        if ((pvVar6[local_10c] == 0.0) && (!NAN(pvVar6[local_10c]))) {
          return false;
        }
      }
    }
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,0);
    __last1._M_current = (double *)*pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,0);
    __first._M_current = (double *)(__last1._M_current * *pvVar7);
    if (((double)__first._M_current != 0.0) || (NAN((double)__first._M_current))) {
      if ((iVar8 == 1) && (iVar9 == 1)) {
        std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
        std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
        std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffdf8);
        std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffdf8);
        std::
        fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                  (__first,in_stack_fffffffffffffe08,(double *)in_stack_fffffffffffffe00.gain);
      }
      else if ((iVar8 == 1) && (iVar9 != 1)) {
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
        in_stack_fffffffffffffe08._M_current = (double *)(__first._M_current * *pvVar7);
        std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
        std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffdf8);
        std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffdf8);
        __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
        operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                  in_stack_fffffffffffffe08._M_current,(difference_type)__first._M_current);
        std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffdf8);
        std::
        transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,sptk::FilterCoefficientsToSpectrum::Run(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>*,sptk::FilterCoefficientsToSpectrum::Buffer*)const::__0>
                  (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                   (anon_class_8_1_ba1d7c77)__first._M_current);
        in_stack_fffffffffffffe00.gain = (double)__first._M_current;
      }
      else if ((iVar8 == 1) || (iVar9 != 1)) {
        std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffdf8);
        std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffdf8);
        __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
        operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                  in_stack_fffffffffffffe08._M_current,
                  (difference_type)in_stack_fffffffffffffe00.gain);
        std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffdf8);
        std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffdf8);
        std::
        transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,sptk::FilterCoefficientsToSpectrum::Run(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>*,sptk::FilterCoefficientsToSpectrum::Buffer*)const::__2>
                  (in_RDI,__last1,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                   (anon_class_8_1_898bf87d)in_stack_fffffffffffffe08._M_current);
      }
      else {
        std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffdf8);
        std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffdf8);
        __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
        operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                  in_stack_fffffffffffffe08._M_current,
                  (difference_type)in_stack_fffffffffffffe00.gain);
        std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffdf8);
        std::
        transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,sptk::FilterCoefficientsToSpectrum::Run(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>*,sptk::FilterCoefficientsToSpectrum::Buffer*)const::__1>
                  (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                   in_stack_fffffffffffffe00);
      }
      bVar1 = SpectrumToSpectrum::Run
                        ((SpectrumToSpectrum *)in_stack_fffffffffffffe08._M_current,
                         (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe00.gain);
      if (bVar1) {
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool FilterCoefficientsToSpectrum::Run(
    const std::vector<double>& numerator_coefficients,
    const std::vector<double>& denominator_coefficients,
    std::vector<double>* spectrum,
    FilterCoefficientsToSpectrum::Buffer* buffer) const {
  // Check inputs.
  const int numerator_length(num_numerator_order_ + 1);
  const int denominator_length(num_denominator_order_ + 1);
  if (!is_valid_ ||
      numerator_coefficients.size() !=
          static_cast<std::size_t>(numerator_length) ||
      denominator_coefficients.size() !=
          static_cast<std::size_t>(denominator_length) ||
      NULL == spectrum || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  const int output_length(fft_length_ / 2 + 1);
  if (spectrum->size() != static_cast<std::size_t>(output_length)) {
    spectrum->resize(output_length);
  }
  if (buffer->fast_fourier_transform_input_.size() <
      static_cast<std::size_t>(fft_length_)) {
    buffer->fast_fourier_transform_input_.resize(fft_length_);
  }
  if (buffer->numerator_of_transfer_function_.size() <
      static_cast<std::size_t>(output_length)) {
    buffer->numerator_of_transfer_function_.resize(output_length);
  }
  if (buffer->denominator_of_transfer_function_.size() <
      static_cast<std::size_t>(output_length)) {
    buffer->denominator_of_transfer_function_.resize(output_length);
  }

  // Calculate numerators of transfer function.
  if (1 != numerator_length) {
    std::copy(numerator_coefficients.begin(), numerator_coefficients.end(),
              buffer->fast_fourier_transform_input_.begin());
    std::fill(buffer->fast_fourier_transform_input_.begin() + numerator_length,
              buffer->fast_fourier_transform_input_.end(), 0.0);
    if (!fast_fourier_transform_.Run(
            buffer->fast_fourier_transform_input_,
            &buffer->fast_fourier_transform_real_output_,
            &buffer->fast_fourier_transform_imaginary_output_,
            &buffer->fast_fourier_transform_buffer_)) {
      return false;
    }

    const double* xr(&buffer->fast_fourier_transform_real_output_[0]);
    const double* xi(&buffer->fast_fourier_transform_imaginary_output_[0]);
    double* x(&buffer->numerator_of_transfer_function_[0]);
    for (int i(0); i < output_length; ++i) {
      x[i] = xr[i] * xr[i] + xi[i] * xi[i];
    }
  }

  // Calculate denominators of transfer function.
  if (1 != denominator_length) {
    buffer->fast_fourier_transform_input_[0] = 1.0;
    std::copy(denominator_coefficients.begin() + 1,
              denominator_coefficients.end(),
              buffer->fast_fourier_transform_input_.begin() + 1);
    std::fill(
        buffer->fast_fourier_transform_input_.begin() + denominator_length,
        buffer->fast_fourier_transform_input_.end(), 0.0);
    if (!fast_fourier_transform_.Run(
            buffer->fast_fourier_transform_input_,
            &buffer->fast_fourier_transform_real_output_,
            &buffer->fast_fourier_transform_imaginary_output_,
            &buffer->fast_fourier_transform_buffer_)) {
      return false;
    }

    const double* yr(&buffer->fast_fourier_transform_real_output_[0]);
    const double* yi(&buffer->fast_fourier_transform_imaginary_output_[0]);
    double* y(&buffer->denominator_of_transfer_function_[0]);
    for (int i(0); i < output_length; ++i) {
      y[i] = yr[i] * yr[i] + yi[i] * yi[i];
      if (0.0 == y[i]) {
        return false;
      }
    }
  }

  // Get gain of transfer function.
  const double gain(denominator_coefficients[0] * denominator_coefficients[0]);
  if (0.0 == gain) {
    return false;
  }

  // Calculate power spectrum.
  if (1 == numerator_length && 1 == denominator_length) {
    const double tmp(gain * numerator_coefficients[0] *
                     numerator_coefficients[0]);
    std::fill(spectrum->begin(), spectrum->end(), tmp);
  } else if (1 == numerator_length && 1 != denominator_length) {
    const double tmp(gain * numerator_coefficients[0] *
                     numerator_coefficients[0]);
    std::transform(
        buffer->denominator_of_transfer_function_.begin(),
        buffer->denominator_of_transfer_function_.begin() + output_length,
        spectrum->begin(), [tmp](double y) { return tmp / y; });
  } else if (1 != numerator_length && 1 == denominator_length) {
    std::transform(
        buffer->numerator_of_transfer_function_.begin(),
        buffer->numerator_of_transfer_function_.begin() + output_length,
        spectrum->begin(), [gain](double x) { return gain * x; });
  } else {
    std::transform(
        buffer->numerator_of_transfer_function_.begin(),
        buffer->numerator_of_transfer_function_.begin() + output_length,
        buffer->denominator_of_transfer_function_.begin(), spectrum->begin(),
        [gain](double x, double y) { return gain * x / y; });
  }

  if (!spectrum_to_spectrum_.Run(spectrum)) {
    return false;
  }

  return true;
}